

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

int xmlXPathCompOpEvalFilterFirst
              (xmlXPathParserContextPtr ctxt,xmlXPathStepOpPtr op,xmlNodePtr *first)

{
  int iVar1;
  xmlNodePtr local_58;
  xmlNodePtr last;
  xmlNodeSetPtr pxStack_48;
  int f;
  xmlNodeSetPtr set;
  xmlXPathObjectPtr obj;
  xmlXPathCompExprPtr comp;
  xmlNodePtr *ppxStack_28;
  int total;
  xmlNodePtr *first_local;
  xmlXPathStepOpPtr op_local;
  xmlXPathParserContextPtr ctxt_local;
  
  comp._4_4_ = 0;
  if (ctxt->error == 0) {
    obj = (xmlXPathObjectPtr)ctxt->comp;
    ppxStack_28 = first;
    first_local = (xmlNodePtr *)op;
    op_local = (xmlXPathStepOpPtr)ctxt;
    if ((((((op->ch1 == -1) || (op->ch2 == -1)) ||
          (((xmlXPathStepOp *)obj->nodesetval)[op->ch1].op != XPATH_OP_SORT)) ||
         ((((xmlXPathStepOp *)obj->nodesetval)[op->ch2].op != XPATH_OP_SORT ||
          (last._4_4_ = ((xmlXPathStepOp *)obj->nodesetval)[op->ch2].ch1, last._4_4_ == -1)))) ||
        ((((xmlXPathStepOp *)obj->nodesetval)[last._4_4_].op != XPATH_OP_FUNCTION ||
         ((((xmlXPathStepOp *)obj->nodesetval)[last._4_4_].value5 != (void *)0x0 ||
          (((xmlXPathStepOp *)obj->nodesetval)[last._4_4_].value != 0)))))) ||
       ((((xmlXPathStepOp *)obj->nodesetval)[last._4_4_].value4 == (void *)0x0 ||
        (iVar1 = xmlStrEqual((xmlChar *)((xmlXPathStepOp *)obj->nodesetval)[last._4_4_].value4,
                             (xmlChar *)"last"), iVar1 == 0)))) {
      if (*(int *)((long)first_local + 4) != -1) {
        iVar1 = xmlXPathCompOpEval((xmlXPathParserContextPtr)op_local,
                                   (xmlXPathStepOpPtr)
                                   ((long)obj->nodesetval +
                                   (long)*(int *)((long)first_local + 4) * 0x38));
        comp._4_4_ = iVar1 + comp._4_4_;
      }
      if (op_local->value2 == 0) {
        if (*(int *)(first_local + 1) == -1) {
          ctxt_local._4_4_ = comp._4_4_;
        }
        else if (op_local->value5 == (void *)0x0) {
          ctxt_local._4_4_ = comp._4_4_;
        }
        else if ((op_local->value5 == (void *)0x0) || (*op_local->value5 != 1)) {
          xmlXPathErr((xmlXPathParserContextPtr)op_local,0xb);
          ctxt_local._4_4_ = 0;
        }
        else {
          set = (xmlNodeSetPtr)valuePop((xmlXPathParserContextPtr)op_local);
          pxStack_48 = ((xmlXPathObjectPtr)set)->nodesetval;
          if ((pxStack_48 != (xmlNodeSetPtr)0x0) &&
             (xmlXPathNodeSetFilter
                        ((xmlXPathParserContextPtr)op_local,pxStack_48,*(int *)(first_local + 1),1,1
                         ,1), 0 < pxStack_48->nodeNr)) {
            *ppxStack_28 = *pxStack_48->nodeTab;
          }
          valuePush((xmlXPathParserContextPtr)op_local,(xmlXPathObjectPtr)set);
          ctxt_local._4_4_ = comp._4_4_;
        }
      }
      else {
        ctxt_local._4_4_ = 0;
      }
    }
    else {
      local_58 = (xmlNodePtr)0x0;
      iVar1 = xmlXPathCompOpEvalLast
                        ((xmlXPathParserContextPtr)op_local,
                         (xmlXPathStepOpPtr)
                         ((long)obj->nodesetval + (long)*(int *)((long)first_local + 4) * 0x38),
                         &local_58);
      comp._4_4_ = iVar1 + comp._4_4_;
      if (op_local->value2 == 0) {
        if ((((op_local->value5 != (void *)0x0) && (*op_local->value5 == 1)) &&
            (*(long *)((long)op_local->value5 + 8) != 0)) &&
           ((*(long *)(*(long *)((long)op_local->value5 + 8) + 8) != 0 &&
            (1 < **(int **)((long)op_local->value5 + 8))))) {
          xmlXPathNodeSetKeepLast(*(xmlNodeSetPtr *)((long)op_local->value5 + 8));
          *ppxStack_28 = (xmlNodePtr)**(undefined8 **)(*(long *)((long)op_local->value5 + 8) + 8);
        }
        ctxt_local._4_4_ = comp._4_4_;
      }
      else {
        ctxt_local._4_4_ = 0;
      }
    }
  }
  else {
    ctxt_local._4_4_ = 0;
  }
  return ctxt_local._4_4_;
}

Assistant:

static int
xmlXPathCompOpEvalFilterFirst(xmlXPathParserContextPtr ctxt,
			      xmlXPathStepOpPtr op, xmlNodePtr * first)
{
    int total = 0;
    xmlXPathCompExprPtr comp;
    xmlXPathObjectPtr obj;
    xmlNodeSetPtr set;

    CHECK_ERROR0;
    comp = ctxt->comp;
    /*
    * Optimization for ()[last()] selection i.e. the last elem
    */
    if ((op->ch1 != -1) && (op->ch2 != -1) &&
	(comp->steps[op->ch1].op == XPATH_OP_SORT) &&
	(comp->steps[op->ch2].op == XPATH_OP_SORT)) {
	int f = comp->steps[op->ch2].ch1;

	if ((f != -1) &&
	    (comp->steps[f].op == XPATH_OP_FUNCTION) &&
	    (comp->steps[f].value5 == NULL) &&
	    (comp->steps[f].value == 0) &&
	    (comp->steps[f].value4 != NULL) &&
	    (xmlStrEqual
	    (comp->steps[f].value4, BAD_CAST "last"))) {
	    xmlNodePtr last = NULL;

	    total +=
		xmlXPathCompOpEvalLast(ctxt,
		    &comp->steps[op->ch1],
		    &last);
	    CHECK_ERROR0;
	    /*
	    * The nodeset should be in document order,
	    * Keep only the last value
	    */
	    if ((ctxt->value != NULL) &&
		(ctxt->value->type == XPATH_NODESET) &&
		(ctxt->value->nodesetval != NULL) &&
		(ctxt->value->nodesetval->nodeTab != NULL) &&
		(ctxt->value->nodesetval->nodeNr > 1)) {
                xmlXPathNodeSetKeepLast(ctxt->value->nodesetval);
		*first = *(ctxt->value->nodesetval->nodeTab);
	    }
	    return (total);
	}
    }

    if (op->ch1 != -1)
	total += xmlXPathCompOpEval(ctxt, &comp->steps[op->ch1]);
    CHECK_ERROR0;
    if (op->ch2 == -1)
	return (total);
    if (ctxt->value == NULL)
	return (total);

    /*
     * In case of errors, xmlXPathNodeSetFilter can pop additional nodes from
     * the stack. We have to temporarily remove the nodeset object from the
     * stack to avoid freeing it prematurely.
     */
    CHECK_TYPE0(XPATH_NODESET);
    obj = valuePop(ctxt);
    set = obj->nodesetval;
    if (set != NULL) {
        xmlXPathNodeSetFilter(ctxt, set, op->ch2, 1, 1, 1);
        if (set->nodeNr > 0)
            *first = set->nodeTab[0];
    }
    valuePush(ctxt, obj);

    return (total);
}